

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QString * buttonDefaultText(QString *__return_storage_ptr__,int wstyle,int which,
                           QWizardPrivate *wizardPrivate)

{
  int iVar1;
  
  switch(which) {
  case 0:
    if (wstyle == 2) {
      iVar1 = 0x6f88ab;
    }
    else {
      iVar1 = 0x6f88b3;
    }
    break;
  case 1:
    if (wstyle == 2) {
      iVar1 = 0x6f88bb;
    }
    else {
      iVar1 = 0x6f88c4;
    }
    break;
  case 2:
    iVar1 = 0x6f88cc;
    break;
  case 3:
    if (wstyle == 2) {
      iVar1 = 0x6f88d3;
    }
    else {
      iVar1 = 0x6f88d8;
    }
    break;
  case 4:
    iVar1 = 0x6f78b4;
    break;
  case 5:
    if (wstyle == 2) {
      iVar1 = 0x6f88e1;
    }
    else {
      iVar1 = 0x6f88e0;
    }
    break;
  default:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
  QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QWizard::staticMetaObject,iVar1);
  return __return_storage_ptr__;
}

Assistant:

static QString buttonDefaultText(int wstyle, int which, const QWizardPrivate *wizardPrivate)
{
#if !QT_CONFIG(style_windowsvista)
    Q_UNUSED(wizardPrivate);
#endif
    const bool macStyle = (wstyle == QWizard::MacStyle);
    switch (which) {
    case QWizard::BackButton:
        return macStyle ? QWizard::tr("Go Back") : QWizard::tr("< &Back");
    case QWizard::NextButton:
        if (macStyle)
            return QWizard::tr("Continue");
        else
            return wizardPrivate->isVistaThemeEnabled()
                ? QWizard::tr("&Next") : QWizard::tr("&Next >");
    case QWizard::CommitButton:
        return QWizard::tr("Commit");
    case QWizard::FinishButton:
        return macStyle ? QWizard::tr("Done") : QWizard::tr("&Finish");
    case QWizard::CancelButton:
        return QWizard::tr("Cancel");
    case QWizard::HelpButton:
        return macStyle ? QWizard::tr("Help") : QWizard::tr("&Help");
    default:
        return QString();
    }
}